

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

UBool __thiscall
icu_63::InitialTimeZoneRule::operator==(InitialTimeZoneRule *this,TimeZoneRule *that)

{
  bool bVar1;
  UBool UVar2;
  bool local_29;
  bool local_19;
  TimeZoneRule *that_local;
  InitialTimeZoneRule *this_local;
  
  local_19 = true;
  if (&this->super_TimeZoneRule != that) {
    if (this == (InitialTimeZoneRule *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator==
                      ((type_info *)(this->super_TimeZoneRule).super_UObject._vptr_UObject[-1],
                       (type_info *)(that->super_UObject)._vptr_UObject[-1]);
    local_29 = false;
    if (bVar1) {
      UVar2 = TimeZoneRule::operator==(&this->super_TimeZoneRule,that);
      local_29 = UVar2 != '\0';
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

UBool
InitialTimeZoneRule::operator==(const TimeZoneRule& that) const {
    return ((this == &that) ||
            (typeid(*this) == typeid(that) &&
            TimeZoneRule::operator==(that)));
}